

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElDisc.cpp
# Opt level: O2

void __thiscall
TPZCompElDisc::TPZCompElDisc
          (TPZCompElDisc *this,TPZCompMesh *mesh,TPZCompElDisc *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  mapped_type_conflict mVar1;
  TPZReference *pTVar2;
  mapped_type_conflict *pmVar3;
  long *plVar4;
  TPZIntPoints *rval;
  TPZAutoPointer<TPZFunction<double>_> local_48;
  TPZManVector<double,_3> *local_40;
  TPZAutoPointer<TPZFunction<double>_> *local_38;
  
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl = &PTR__TPZSavable_0177a578;
  TPZInterpolationSpace::TPZInterpolationSpace
            (&this->super_TPZInterpolationSpace,&PTR_PTR_01779ec0,mesh,
             &copy->super_TPZInterpolationSpace);
  *(undefined ***)&(this->super_TPZInterpolationSpace).super_TPZCompEl =
       &PTR__TPZCompElDisc_01779b50;
  TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&this->fIntRule);
  this->fConnectIndex = -1;
  TPZAutoPointer<TPZFunction<double>_>::TPZAutoPointer(&this->fExternalShape);
  local_40 = &this->fCenterPoint;
  local_38 = &this->fExternalShape;
  TPZManVector<double,_3>::TPZManVector(local_40,&copy->fCenterPoint);
  this->fShapefunctionType = copy->fShapefunctionType;
  mVar1 = (copy->super_TPZInterpolationSpace).super_TPZCompEl.fIndex;
  pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](gl2lcElMap,&(this->super_TPZInterpolationSpace).super_TPZCompEl.fIndex);
  *pmVar3 = mVar1;
  pTVar2 = (copy->fIntRule).fRef;
  if ((pTVar2 == (TPZReference *)0x0) || (pTVar2->fPointer == (TPZIntPoints *)0x0)) {
    rval = (TPZIntPoints *)0x0;
  }
  else {
    plVar4 = (long *)(**(code **)(*(long *)&(copy->super_TPZInterpolationSpace).super_TPZCompEl +
                                 0x240))(copy);
    rval = (TPZIntPoints *)(**(code **)(*plVar4 + 0x48))(plVar4);
  }
  TPZAutoPointer<TPZIntPoints>::operator=(&this->fIntRule,rval);
  local_48.fRef = (copy->fExternalShape).fRef;
  LOCK();
  ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  SetExternalShapeFunction(this,&local_48);
  TPZAutoPointer<TPZFunction<double>_>::~TPZAutoPointer(&local_48);
  this->fUseQsiEta = copy->fUseQsiEta;
  return;
}

Assistant:

TPZCompElDisc::TPZCompElDisc(TPZCompMesh &mesh,
                             const TPZCompElDisc &copy,
                             std::map<int64_t,int64_t> &gl2lcConMap,
                             std::map<int64_t,int64_t> &gl2lcElMap) : 
TPZRegisterClassId(&TPZCompElDisc::ClassId),TPZInterpolationSpace(mesh,copy), fConnectIndex(-1), fCenterPoint(copy.fCenterPoint)
{
	fShapefunctionType = copy.fShapefunctionType;
	//TPZMaterial * mat = copy.Material();
	gl2lcElMap[this->fIndex] = copy.fIndex;
	
	if (copy.fIntRule){
		this->fIntRule = copy.GetIntegrationRule().Clone();
	}
	else{
		this->fIntRule = NULL;
	}
	
	this->SetExternalShapeFunction(copy.fExternalShape);
    fUseQsiEta = copy.fUseQsiEta;
}